

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_dictionary.cpp
# Opt level: O2

PreparedDictionary *
duckdb_brotli::CreatePreparedDictionary(MemoryManager *m,uint8_t *source,size_t source_size)

{
  void *__s;
  byte *pbVar1;
  short sVar2;
  byte bVar3;
  byte bVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  size_t volume;
  ulong uVar8;
  void *p;
  ulong uVar9;
  PreparedDictionary *pPVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint32_t uVar14;
  size_t n;
  ushort uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  size_t j;
  ulong uVar19;
  undefined4 uVar20;
  long lVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  byte bVar25;
  
  uVar8 = 0x200000;
  uVar18 = 7;
  bVar25 = 0x2f;
  for (uVar17 = 0x11; (uVar8 < source_size && (uVar17 < 0x16)); uVar17 = uVar17 + 1) {
    uVar8 = uVar8 * 2;
    uVar18 = uVar18 + 1;
    bVar25 = bVar25 - 1;
  }
  bVar3 = (byte)uVar18;
  uVar11 = 1 << (bVar3 & 0x1f);
  bVar4 = (byte)uVar17;
  uVar23 = 1 << (bVar4 & 0x1f);
  lVar21 = 2L << (bVar4 & 0x3f);
  if ((uVar17 < uVar18 || 0x10 < uVar18) || 0xf < uVar17 - uVar18) {
    pPVar10 = (PreparedDictionary *)0x0;
  }
  else {
    uVar12 = 0;
    n = (4L << (bVar4 & 0x3f)) + lVar21 + (8L << (bVar3 & 0x3f)) + source_size * 4;
    if (n == 0) {
      p = (void *)0x0;
    }
    else {
      p = BrotliAllocate(m,n);
    }
    uVar22 = (ulong)uVar11;
    __s = (void *)((long)p + uVar22 * 8);
    uVar24 = (ulong)uVar23;
    uVar8 = (ulong)(uVar23 * 2);
    lVar5 = uVar24 * 4 + uVar8;
    switchD_014c69ad::default(__s,0,uVar8);
    for (; uVar12 + 7 < source_size; uVar12 = uVar12 + 1) {
      uVar9 = (*(ulong *)(source + uVar12) & 0xffffffffff) * 0x1fe35a7bd3579bd3 >> (bVar25 & 0x3f) &
              0xffffffff;
      sVar2 = *(short *)((long)__s + uVar9 * 2);
      uVar20 = 0xffffffff;
      if (sVar2 != 0) {
        uVar20 = *(undefined4 *)((long)__s + uVar9 * 4 + uVar8);
      }
      *(undefined4 *)((long)__s + (ulong)uVar12 * 4 + lVar5) = uVar20;
      *(uint *)((long)__s + uVar9 * 4 + uVar8) = uVar12;
      uVar15 = sVar2 + 1;
      if (0x1f < uVar15) {
        uVar15 = 0x20;
      }
      *(ushort *)((long)__s + uVar9 * 2) = uVar15;
    }
    uVar9 = 0;
    uVar23 = 0;
LAB_01e608ea:
    if (uVar9 != uVar22) {
      uVar12 = 0x20;
      do {
        uVar13 = 0;
        uVar19 = uVar9;
        while( true ) {
          if (uVar24 <= uVar19) {
            *(uint *)((long)p + uVar9 * 4 + uVar22 * 4) = uVar12;
            *(uint *)((long)p + uVar9 * 4) = uVar13;
            uVar23 = uVar23 + uVar13;
            uVar9 = uVar9 + 1;
            goto LAB_01e608ea;
          }
          if (0xfffe < uVar13) break;
          uVar16 = (uint)*(ushort *)((long)__s + uVar19 * 2);
          if (uVar12 < uVar16) {
            uVar16 = uVar12;
          }
          uVar13 = uVar13 + uVar16;
          uVar19 = uVar19 + uVar22;
        }
        uVar12 = uVar12 - 1;
      } while( true );
    }
    pPVar10 = (PreparedDictionary *)
              BrotliAllocate(m,(4L << (bVar3 & 0x3f)) + lVar21 + (ulong)uVar23 * 4 + 0x20);
    lVar21 = uVar22 * 4;
    pPVar10->magic = 0xdebcede3;
    pPVar10->num_items = uVar23;
    pPVar10->source_size = (uint32_t)source_size;
    pPVar10->hash_bits = 0x28;
    pPVar10->bucket_bits = uVar17;
    pPVar10->slot_bits = uVar18;
    *(uint8_t **)((long)&pPVar10[1].magic + (ulong)uVar23 * 4 + uVar24 * 2 + lVar21) = source;
    uVar14 = 0;
    for (uVar9 = 0; uVar22 != uVar9; uVar9 = uVar9 + 1) {
      (&pPVar10[1].magic)[uVar9] = uVar14;
      uVar14 = uVar14 + *(int *)((long)p + uVar9 * 4);
      *(undefined4 *)((long)p + uVar9 * 4) = 0;
    }
    for (uVar9 = 0; uVar9 != uVar24; uVar9 = uVar9 + 1) {
      uVar19 = (ulong)(uVar11 - 1 & (uint)uVar9);
      uVar18 = *(uint *)((long)p + uVar19 * 4 + uVar22 * 4);
      uVar17 = (uint)*(ushort *)((long)__s + uVar9 * 2);
      if (uVar18 < uVar17) {
        uVar17 = uVar18;
      }
      if (uVar17 == 0) {
        *(undefined2 *)((long)&pPVar10[1].magic + uVar9 * 2 + lVar21) = 0xffff;
      }
      else {
        uVar18 = *(uint *)((long)p + uVar19 * 4);
        *(short *)((long)&pPVar10[1].magic + uVar9 * 2 + lVar21) = (short)uVar18;
        uVar23 = (&pPVar10[1].magic)[uVar19];
        *(uint *)((long)p + uVar19 * 4) = uVar18 + uVar17;
        lVar6 = uVar9 * 4 + uVar8;
        lVar7 = ((ulong)uVar23 + (ulong)uVar18) * 4 + uVar24 * 2 + uVar22 * 4 + 0x14;
        for (uVar19 = 0; uVar17 != uVar19; uVar19 = uVar19 + 1) {
          uVar18 = *(uint *)((long)__s + lVar6);
          *(uint *)((long)&pPVar10[1].magic + uVar19 * 4 + lVar7 + -0x14) = uVar18;
          lVar6 = (ulong)uVar18 * 4 + lVar5;
        }
        pbVar1 = (byte *)((long)&pPVar10->slot_bits + uVar19 * 4 + lVar7 + -0x11);
        *pbVar1 = *pbVar1 | 0x80;
      }
    }
    BrotliFree(m,p);
  }
  return pPVar10;
}

Assistant:

PreparedDictionary* duckdb_brotli::CreatePreparedDictionary(MemoryManager* m,
    const uint8_t* source, size_t source_size) {
  uint32_t bucket_bits = 17;
  uint32_t slot_bits = 7;
  uint32_t hash_bits = 40;
  uint16_t bucket_limit = 32;
  size_t volume = 16u << bucket_bits;
  /* Tune parameters to fit dictionary size. */
  while (volume < source_size && bucket_bits < 22) {
    bucket_bits++;
    slot_bits++;
    volume <<= 1;
  }
  return CreatePreparedDictionaryWithParams(m,
      source, source_size, bucket_bits, slot_bits, hash_bits, bucket_limit);
}